

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftmgr.c
# Opt level: O1

int ftmgr_aeq_handle(ftmgr *ftmgr,uint8_t aeq,uint8_t *offset)

{
  ulong uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  ulong uVar7;
  long lVar8;
  unsigned_long uVar9;
  bool bVar10;
  timeval local_38;
  
  if (((ftmgr->bitmap >> ((uint)CONCAT71(in_register_00000031,aeq) & 0x1f) & 1) == 0) &&
     (*(int *)ftmgr->ftq[aeq].blk == *(int *)offset)) {
    ftmgr->tts = ftmgr->tts + -1;
    ftmgr->bitmap = (byte)(1 << (aeq & 0x1f)) | ftmgr->bitmap;
    lVar8 = (ulong)ftmgr->ftq[aeq].size - 4;
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    uVar7 = (ftmgr->pr).pr_cursize + lVar8;
    uVar9 = local_38.tv_sec * 1000000 + local_38.tv_usec;
    (ftmgr->pr).pr_cursize = uVar7;
    uVar1 = (ftmgr->pr).pr_total;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar1;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar7 * 100;
    if ((ftmgr->pr).pr_start == 0) {
      (ftmgr->pr).pr_start = uVar9;
    }
    uVar2 = (ftmgr->pr).pr_time;
    if (uVar2 != 0) {
      iVar5 = SUB164(auVar4 / auVar3,0);
      iVar6 = iVar5 + 3;
      if (-1 < iVar5) {
        iVar6 = iVar5;
      }
      mgr_print((ftmgr->pr).chmgr,"%s %3d%% [%.*s%.*s] %ld B/s %ld/%ld KB    \r","send",
                SUB168(auVar4 / auVar3,0),(ulong)(uint)(iVar6 >> 2),"#########################",
                (ulong)(0x19 - (iVar6 >> 2)),"                         ",
                (ulong)(lVar8 * 1000000) / (uVar9 - uVar2),uVar7 >> 10,uVar1 >> 10);
    }
    uVar1 = (ftmgr->pr).pr_total;
    if ((ftmgr->pr).pr_cursize == uVar1) {
      uVar7 = uVar9 - (ftmgr->pr).pr_start;
      mgr_print((ftmgr->pr).chmgr,"\nTotal: %ld KB, %ld S, %ld B/s\n",uVar1 >> 10,uVar7 / 1000000,
                (uVar1 * 1000000) / uVar7);
    }
    (ftmgr->pr).pr_time = uVar9;
    ftmgr_fill(ftmgr);
    ftmgr_timedout(ftmgr);
  }
  else if ((*(int *)ftmgr->ftq[aeq].blk != *(int *)offset) && (((byte)loglevel & 1) != 0)) {
    syslog(3,"packted resend seq = %02x\n",CONCAT71(in_register_00000031,aeq) & 0xffffffff);
  }
  bVar10 = ftmgr->bitmap != 0xff;
  if (!bVar10) {
    fm_write(ftmgr->chmgr,0x82,(void *)0x0,0);
  }
  return (uint)bVar10;
}

Assistant:

int ftmgr_aeq_handle(struct ftmgr *ftmgr, uint8_t aeq, const uint8_t offset[4])
{
    if(!(ftmgr->bitmap & (1 << aeq)) && !memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        ftmgr->tts--;
        ftmgr->bitmap |= (1 << aeq);
        progress(&ftmgr->pr, ftmgr->ftq[aeq].size - BLK_HDR_SIZE, "send");
        ftmgr_fill(ftmgr);
        ftmgr_timedout(ftmgr);
    } else if(memcmp(ftmgr->ftq[aeq].blk, offset, 4)) {
        LOGE("packted resend seq = %02x\n", aeq);
    }

    if(ftmgr->bitmap == (__typeof__(ftmgr->bitmap))-1) {
        fm_write(ftmgr->chmgr, CTRL_BLK_COMP, NULL, 0);
        return 0;
    }
    return 1;
}